

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_7246::test_art_simple(void **param_1)

{
  initializer_list<const_char_*> __l;
  initializer_list<(anonymous_namespace)::Value> __l_00;
  bool bVar1;
  size_type sVar2;
  Value *pVVar3;
  reference pvVar4;
  Value *this;
  Value *erased_val;
  Value *found_val;
  size_t i;
  art_t art;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  art_val_t *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  art_t *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffec8;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
  *in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  size_type sVar5;
  size_type in_stack_fffffffffffffee0;
  undefined1 *puVar6;
  size_type local_100;
  undefined1 local_f8 [15];
  undefined1 local_e9;
  Value local_e8;
  Value local_d8;
  Value local_c8;
  Value local_b8;
  Value local_a8;
  Value *local_98;
  undefined8 local_90;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_88 [2];
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char **local_30;
  undefined8 local_28;
  vector<const_char_*,_std::allocator<const_char_*>_> local_20;
  
  local_38 = "001005";
  local_48 = "000003";
  pcStack_40 = "000004";
  local_58 = "000001";
  pcStack_50 = "000002";
  local_30 = &local_58;
  local_28 = 5;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x1025aa);
  __l._M_len = in_stack_fffffffffffffee0;
  __l._M_array = (iterator)in_stack_fffffffffffffed8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffed0,__l,
             (allocator_type *)in_stack_fffffffffffffec8);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1025db);
  Value::Value(&local_e8,1);
  Value::Value(&local_d8,2);
  Value::Value(&local_c8,3);
  Value::Value(&local_b8,4);
  Value::Value(&local_a8,5);
  local_98 = &local_e8;
  local_90 = 5;
  puVar6 = &local_e9;
  std::allocator<(anonymous_namespace)::Value>::allocator
            ((allocator<(anonymous_namespace)::Value> *)0x10266a);
  __l_00._M_len = (size_type)puVar6;
  __l_00._M_array = in_stack_fffffffffffffed8;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (in_stack_fffffffffffffed0,__l_00,in_stack_fffffffffffffec8);
  std::allocator<(anonymous_namespace)::Value>::~allocator
            ((allocator<(anonymous_namespace)::Value> *)0x102698);
  memset(local_f8,0,8);
  local_100 = 0;
  while( true ) {
    sVar5 = local_100;
    sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_20);
    if (sVar2 <= sVar5) break;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,local_100);
    std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
    operator[](local_88,local_100);
    art_insert(in_stack_fffffffffffffeb0,
               (art_key_chunk_t *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0);
    local_100 = local_100 + 1;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,0);
  pVVar3 = (Value *)art_find((art_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                             (art_key_chunk_t *)0x1027d2);
  pvVar4 = std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ::operator[](local_88,0);
  Value::operator==(pVVar3,pvVar4);
  _assert_true((unsigned_long)in_stack_fffffffffffffeb0,
               (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               (char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,0);
  this = (Value *)art_erase((art_t *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0->key);
  pVVar3 = this;
  pvVar4 = std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ::operator[](local_88,0);
  bVar1 = Value::operator==(this,pvVar4);
  _assert_true((unsigned_long)pVVar3,(char *)CONCAT17(bVar1,in_stack_fffffffffffffea8),(char *)this,
               in_stack_fffffffffffffe9c);
  art_free((art_t *)0x1028c4);
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::~vector
            ((vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> *)
             pVVar3);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)pVVar3);
  return;
}

Assistant:

DEFINE_TEST(test_art_simple) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};

    art_t art{NULL};
    for (size_t i = 0; i < keys.size(); ++i) {
        art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
    }
    Value* found_val = (Value*)art_find(&art, (uint8_t*)keys[0]);
    assert_true(*found_val == values[0]);
    Value* erased_val = (Value*)art_erase(&art, (uint8_t*)keys[0]);
    assert_true(*erased_val == values[0]);
    art_free(&art);
}